

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

bool __thiscall
notch::core::EpochCallback::operator()(EpochCallback *this,int currentEpoch,bool alwaysInvoke)

{
  bool bVar1;
  undefined7 in_register_00000011;
  int local_4;
  
  if (((int)CONCAT71(in_register_00000011,alwaysInvoke) == 0) &&
     ((this->period < 1 || (currentEpoch % this->period != 0)))) {
    bVar1 = false;
  }
  else {
    if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    bVar1 = (*(this->callback)._M_invoker)((_Any_data *)&this->callback,&local_4);
  }
  return bVar1;
}

Assistant:

bool operator()(int currentEpoch, bool alwaysInvoke = false) const {
        if (alwaysInvoke || (period > 0 && currentEpoch % period == 0)) {
            return callback(currentEpoch);
        } else {
            return false;
        }
    }